

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O0

void __thiscall IMLE::setParameters(IMLE *this,Param *prm)

{
  int *in_RSI;
  IMLE *in_RDI;
  IMLE *in_stack_00000010;
  Param *in_stack_ffffffffffffffa8;
  allocator *msg;
  allocator local_31;
  string local_30 [48];
  
  if ((*in_RSI == in_RDI->d) && (in_RSI[1] == in_RDI->D)) {
    Param::operator=((Param *)in_RDI,in_stack_ffffffffffffffa8);
    set_internal_parameters(in_stack_00000010);
  }
  else {
    msg = &local_31;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_30,"IMLE::setParameters: parameter dimensions do not match!!",msg);
    message(in_RDI,(string *)msg);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  return;
}

Assistant:

IMLE_CLASS_TEMPLATE
void IMLE_base::setParameters(Param const &prm)
{
#ifdef IMLE_NO_TEMPLATES
    // Check dimensions
    if( prm.d != d || prm.D != D)
    {
        message("IMLE::setParameters: parameter dimensions do not match!!");
        return;
    }
#endif

    param = prm;
    set_internal_parameters();
}